

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  connectdata *local_38;
  connectdata *conn;
  _Bool *p_Stack_28;
  CURLcode result;
  _Bool *protocol_done_local;
  _Bool *asyncp_local;
  Curl_easy *data_local;
  
  *asyncp = false;
  p_Stack_28 = protocol_done;
  protocol_done_local = asyncp;
  asyncp_local = (_Bool *)data;
  Curl_free_request_state(data);
  memset(asyncp_local + 0xf0,0,0x578);
  asyncp_local[0xf8] = true;
  asyncp_local[0xf9] = true;
  asyncp_local[0xfa] = true;
  asyncp_local[0xfb] = true;
  asyncp_local[0xfc] = true;
  asyncp_local[0xfd] = true;
  asyncp_local[0xfe] = true;
  asyncp_local[0xff] = true;
  conn._4_4_ = create_conn((Curl_easy *)asyncp_local,&local_38,protocol_done_local);
  if (conn._4_4_ == CURLE_OK) {
    if ((local_38->easyq).size == 0) {
      if ((*protocol_done_local & 1U) == 0) {
        conn._4_4_ = Curl_setup_conn(local_38,p_Stack_28);
      }
    }
    else {
      *p_Stack_28 = true;
    }
  }
  if (conn._4_4_ == CURLE_NO_CONNECTION_AVAILABLE) {
    data_local._4_4_ = conn._4_4_;
  }
  else {
    if ((conn._4_4_ == CURLE_OK) || (local_38 == (connectdata *)0x0)) {
      if ((conn._4_4_ == CURLE_OK) && (*(long *)(asyncp_local + 0x10) == 0)) {
        Curl_attach_connnection((Curl_easy *)asyncp_local,local_38);
      }
    }
    else {
      Curl_disconnect((Curl_easy *)asyncp_local,local_38,true);
    }
    data_local._4_4_ = conn._4_4_;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn))
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(conn, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_disconnect(data, conn, TRUE);
  }
  else if(!result && !data->conn)
    /* FILE: transfers already have the connection attached */
    Curl_attach_connnection(data, conn);

  return result;
}